

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

void __thiscall
procxx::pipe_streambuf::pipe_streambuf(pipe_streambuf *this,size_t buffer_size,size_t put_back_size)

{
  size_type __n;
  reference pvVar1;
  value_type *begin;
  size_t local_20;
  size_t put_back_size_local;
  size_t buffer_size_local;
  pipe_streambuf *this_local;
  
  local_20 = put_back_size;
  put_back_size_local = buffer_size;
  buffer_size_local = (size_t)this;
  pipe_ostreambuf::pipe_ostreambuf(&this->super_pipe_ostreambuf,buffer_size,put_back_size);
  *(undefined ***)&this->super_pipe_ostreambuf = &PTR__pipe_streambuf_00218488;
  pipe_t::pipe_t(&this->stdin_pipe_);
  __n = put_back_size_local + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (&this->out_buffer_,__n,(allocator_type *)((long)&begin + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&begin + 3));
  pvVar1 = std::vector<char,_std::allocator<char>_>::front(&this->out_buffer_);
  std::vector<char,_std::allocator<char>_>::size(&this->out_buffer_);
  std::streambuf::setp((char *)this,pvVar1);
  return;
}

Assistant:

pipe_streambuf(size_t buffer_size = 512, size_t put_back_size = 8)
      : pipe_ostreambuf{buffer_size, put_back_size},
        out_buffer_(buffer_size + 1) {
    auto begin = &out_buffer_.front();
    setp(begin, begin + out_buffer_.size() - 1);
  }